

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testToFloat.cpp
# Opt level: O2

void testToFloat(void)

{
  float fVar1;
  ostream *poVar2;
  long lVar3;
  half h;
  half local_1e;
  float local_1c;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"running testToFloat");
  std::endl<char,std::char_traits<char>>(poVar2);
  lVar3 = 0;
  do {
    if (lVar3 == 0x10000) {
      poVar2 = std::operator<<((ostream *)&std::cout,"ok");
      std::endl<char,std::char_traits<char>>(poVar2);
      return;
    }
    local_1c = *(float *)(_imath_half_to_float_table + lVar3 * 4);
    Imath_3_2::half::half(&local_1e,local_1c);
    fVar1 = (float)halfToFloat((unsigned_short)lVar3);
    if (NAN(local_1c)) {
      if (((~local_1e._h & 0x7c00) != 0) || ((local_1e._h & 0x3ff) == 0)) {
        __assert_fail("h.isNan ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testToFloat.cpp"
                      ,0x8e,"void testToFloat()");
      }
      if (!NAN(fVar1)) {
        __assert_fail("isnan (uif.f)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testToFloat.cpp"
                      ,0x8f,"void testToFloat()");
      }
    }
    else if (ABS(local_1c) == INFINITY) {
      if ((local_1e._h & 0x7fff) != 0x7c00) {
        __assert_fail("h.isInfinity ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testToFloat.cpp"
                      ,0x93,"void testToFloat()");
      }
      if (ABS(fVar1) != INFINITY) {
        __assert_fail("isinf (uif.f)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testToFloat.cpp"
                      ,0x94,"void testToFloat()");
      }
    }
    else if ((local_1c != fVar1) || (NAN(local_1c) || NAN(fVar1))) {
      __assert_fail("f == uif.f",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testToFloat.cpp"
                    ,0x98,"void testToFloat()");
    }
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

void
testToFloat ()
{
    std::cout << "running testToFloat" << std::endl;

    constexpr int iMax = (1 << 16);

    //
    // for each 16-bit bit pattern...
    //

    for (unsigned int s = 0; s < iMax; s++)
    {
        half hs (half::FromBits, static_cast<unsigned short> (s));
        assert (hs.bits () == s);

        //
        // cast these bits to a float, using the cast-to-float
        // operator.
        //

        float f = float (hs); // = _toFloat[s]

        //
        // Cast that float back to a half.
        //

        half h = half (f);

        //
        // halfToFloat() above is what generated the _toFloat table.
        // The i value return is the integer bit pattern of the corresponding
        // float.
        //

        half::uif uif;
        uif.i = halfToFloat (s);

        //
        // Equality operators fail for inf and nan, so handle them
        // specially.
        //

        if (isnan (f))
        {
            assert (h.isNan ());
            assert (isnan (uif.f));
        }
        else if (isinf (f))
        {
            assert (h.isInfinity ());
            assert (isinf (uif.f));
        }
        else
        {
            assert (f == uif.f);
        }
    }

    std::cout << "ok" << std::endl;
}